

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O3

void __thiscall
FilmGrainTableTest_SplitSingleSegment_Test::TestBody
          (FilmGrainTableTest_SplitSingleSegment_Test *this)

{
  undefined8 *puVar1;
  size_type sVar2;
  int iVar3;
  pointer *__ptr;
  SEARCH_METHODS *pSVar4;
  char *in_R9;
  aom_film_grain_table_t table;
  aom_film_grain_t grain;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e0;
  undefined8 *local_2d8;
  string local_2d0;
  AssertHelper local_2b0;
  aom_film_grain_table_t local_2a8;
  aom_film_grain_t local_290;
  
  local_2a8.head = (aom_film_grain_table_entry_t *)0x0;
  local_2a8.tail = (aom_film_grain_table_entry_t *)0x0;
  aom_film_grain_table_append(&local_2a8,0,1000,film_grain_test_vectors);
  iVar3 = aom_film_grain_table_lookup(&local_2a8,0,100,1,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 != 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d0,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 0, 100, true, &grain)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x86,(char *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,
                                      (char)local_2d0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,(char)local_2d0._M_dataplus._M_p) !=
        &local_2d0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2d0._M_dataplus._M_p._1_7_,(char)local_2d0._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
    puVar1 = local_2d8;
    if (local_2d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
        operator_delete((undefined8 *)*local_2d8);
      }
      operator_delete(puVar1);
    }
  }
  local_2e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_2a8.head)->next;
  local_2e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<aom_film_grain_table_entry_t*,aom_film_grain_table_entry_t*>
            ((internal *)&local_2d0,"nullptr","table.head->next",
             (aom_film_grain_table_entry_t **)&local_2e8,(aom_film_grain_table_entry_t **)&local_2e0
            );
  if ((char)local_2d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x87,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((aom_film_grain_table_entry_t *)local_2e0._M_head_impl !=
        (aom_film_grain_table_entry_t *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2d0._M_string_length;
  if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2d0._M_string_length !=
        (undefined8 *)(local_2d0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2d0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_2e0._M_head_impl._0_4_ = 100;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_2d0,"100","table.head->start_time",(int *)&local_2e0,
             &(local_2a8.head)->start_time);
  if ((char)local_2d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x88,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2d0._M_string_length;
  if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2d0._M_string_length !=
        (undefined8 *)(local_2d0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2d0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  iVar3 = aom_film_grain_table_lookup(&local_2a8,900,1000,1,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 != 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d0,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 900, 1000, true, &grain)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x8b,(char *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,
                                      (char)local_2d0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,(char)local_2d0._M_dataplus._M_p) !=
        &local_2d0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2d0._M_dataplus._M_p._1_7_,(char)local_2d0._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
    puVar1 = local_2d8;
    if (local_2d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
        operator_delete((undefined8 *)*local_2d8);
      }
      operator_delete(puVar1);
    }
  }
  local_2e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_2a8.head)->next;
  local_2e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<aom_film_grain_table_entry_t*,aom_film_grain_table_entry_t*>
            ((internal *)&local_2d0,"nullptr","table.head->next",
             (aom_film_grain_table_entry_t **)&local_2e8,(aom_film_grain_table_entry_t **)&local_2e0
            );
  if ((char)local_2d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x8c,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if ((aom_film_grain_table_entry_t *)local_2e0._M_head_impl !=
        (aom_film_grain_table_entry_t *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2d0._M_string_length;
  if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2d0._M_string_length !=
        (undefined8 *)(local_2d0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2d0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_2e0._M_head_impl._0_4_ = 100;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_2d0,"100","table.head->start_time",(int *)&local_2e0,
             &(local_2a8.head)->start_time);
  if ((char)local_2d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x8d,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2d0._M_string_length;
  if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2d0._M_string_length !=
        (undefined8 *)(local_2d0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2d0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_2e0._M_head_impl._0_4_ = 900;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_2d0,"900","table.head->end_time",(int *)&local_2e0,
             &(local_2a8.head)->end_time);
  if ((char)local_2d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x8e,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2d0._M_string_length;
  if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2d0._M_string_length !=
        (undefined8 *)(local_2d0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2d0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  iVar3 = aom_film_grain_table_lookup(&local_2a8,400,600,1,&local_290);
  local_2e0._M_head_impl._0_1_ = iVar3 != 0;
  local_2d8 = (undefined8 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d0,(internal *)&local_2e0,
               (AssertionResult *)"aom_film_grain_table_lookup(&table, 400, 600, true, &grain)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x91,(char *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,
                                      (char)local_2d0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,(char)local_2d0._M_dataplus._M_p) !=
        &local_2d0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2d0._M_dataplus._M_p._1_7_,(char)local_2d0._M_dataplus._M_p));
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._M_head_impl + 8))();
    }
    puVar1 = local_2d8;
    if (local_2d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_2d8 != local_2d8 + 2) {
        operator_delete((undefined8 *)*local_2d8);
      }
      operator_delete(puVar1);
    }
  }
  local_2e0._M_head_impl._0_4_ = 100;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_2d0,"100","table.head->start_time",(int *)&local_2e0,
             &(local_2a8.head)->start_time);
  if ((char)local_2d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x92,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2d0._M_string_length;
  if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2d0._M_string_length !=
        (undefined8 *)(local_2d0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2d0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_2e0._M_head_impl._0_4_ = 400;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_2d0,"400","table.head->end_time",(int *)&local_2e0,
             &(local_2a8.head)->end_time);
  if ((char)local_2d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x93,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
  }
  sVar2 = local_2d0._M_string_length;
  if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_2d0._M_string_length !=
        (undefined8 *)(local_2d0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_2d0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_2e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aom_film_grain_table_entry_t*>
            ((internal *)&local_2d0,"nullptr","table.head->next",&local_2e0._M_head_impl,
             &(local_2a8.head)->next);
  sVar2 = local_2d0._M_string_length;
  if ((char)local_2d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x95,(char *)pSVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
    }
    if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2d0._M_string_length !=
          (undefined8 *)(local_2d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_2d0._M_string_length);
      }
      operator_delete((void *)local_2d0._M_string_length);
    }
  }
  else {
    if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2d0._M_string_length !=
          (undefined8 *)(local_2d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_2d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    testing::internal::CmpHelperEQ<aom_film_grain_table_entry_t*,aom_film_grain_table_entry_t*>
              ((internal *)&local_2d0,"table.tail","table.head->next",&local_2a8.tail,
               &(local_2a8.head)->next);
    if ((char)local_2d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_2e0);
      if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x96,(char *)pSVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
      if (local_2e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_2d0._M_string_length;
    if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2d0._M_string_length !=
          (undefined8 *)(local_2d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_2d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    local_2e0._M_head_impl._0_4_ = 600;
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_2d0,"600","table.head->next->start_time",(int *)&local_2e0,
               &(local_2a8.head)->next->start_time);
    if ((char)local_2d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_2e0);
      if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x97,(char *)pSVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
      if (local_2e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
      }
    }
    sVar2 = local_2d0._M_string_length;
    if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2d0._M_string_length !=
          (undefined8 *)(local_2d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_2d0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    local_2e0._M_head_impl._0_4_ = 900;
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&local_2d0,"900","table.head->next->end_time",(int *)&local_2e0,
               &(local_2a8.head)->next->end_time);
    if ((char)local_2d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_2e0);
      if ((undefined8 *)local_2d0._M_string_length == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = *(SEARCH_METHODS **)local_2d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x98,(char *)pSVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
      if (local_2e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
      }
    }
    if ((undefined8 *)local_2d0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2d0._M_string_length !=
          (undefined8 *)(local_2d0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_2d0._M_string_length);
      }
      operator_delete((void *)local_2d0._M_string_length);
    }
    aom_film_grain_table_free(&local_2a8);
  }
  return;
}

Assistant:

TEST(FilmGrainTableTest, SplitSingleSegment) {
  aom_film_grain_table_t table;
  aom_film_grain_t grain;
  memset(&table, 0, sizeof(table));

  aom_film_grain_table_append(&table, 0, 1000, film_grain_test_vectors + 0);

  // Test lookup and remove that adjusts start time
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 0, 100, true, &grain));
  EXPECT_EQ(nullptr, table.head->next);
  EXPECT_EQ(100, table.head->start_time);

  // Test lookup and remove that adjusts end time
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 900, 1000, true, &grain));
  EXPECT_EQ(nullptr, table.head->next);
  EXPECT_EQ(100, table.head->start_time);
  EXPECT_EQ(900, table.head->end_time);

  // Test lookup and remove that splits the first entry
  EXPECT_TRUE(aom_film_grain_table_lookup(&table, 400, 600, true, &grain));
  EXPECT_EQ(100, table.head->start_time);
  EXPECT_EQ(400, table.head->end_time);

  ASSERT_NE(nullptr, table.head->next);
  EXPECT_EQ(table.tail, table.head->next);
  EXPECT_EQ(600, table.head->next->start_time);
  EXPECT_EQ(900, table.head->next->end_time);

  aom_film_grain_table_free(&table);
}